

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord2.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RectangularVolumeRecord2 *this)

{
  ostream *poVar1;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  RectangularVolumeRecord2 *local_18;
  RectangularVolumeRecord2 *this_local;
  
  local_18 = this;
  this_local = (RectangularVolumeRecord2 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  RectangularVolumeRecord1::GetAsString_abi_cxx11_(&local_1c0,&this->super_RectangularVolumeRecord1)
  ;
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\td(Length)/dt: ");
  Vector::GetAsString_abi_cxx11_(&local_1f0,&this->m_DDT);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tVelocity: ");
  Vector::GetAsString_abi_cxx11_(&local_210,&this->m_Velocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\tAngular Velocity: ");
  Vector::GetAsString_abi_cxx11_(&local_230,&this->m_AngularVelocity);
  std::operator<<(poVar1,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString RectangularVolumeRecord2::GetAsString() const
{
    KStringStream ss;

    ss << RectangularVolumeRecord1::GetAsString()
       << "\td(Length)/dt: "      << m_DDT.GetAsString()
       << "\tVelocity: "          << m_Velocity.GetAsString()
       << "\tAngular Velocity: "  << m_AngularVelocity.GetAsString();

    return ss.str();
}